

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsApp.cpp
# Opt level: O2

void __thiscall helics::apps::App::loadTextFile(App *this,string *textFile)

{
  AppTextParser aparser;
  _Vector_base<char,_std::allocator<char>_> local_298;
  _Vector_base<int,_std::allocator<int>_> local_280;
  AppTextParser local_268;
  
  AppTextParser::AppTextParser(&local_268,textFile);
  local_298._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_298._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_298._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  AppTextParser::preParseFile
            ((vector<int,_std::allocator<int>_> *)&local_280,&local_268,
             (vector<char,_std::allocator<char>_> *)&local_298);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_280);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_298);
  loadConfigOptions(this,&local_268);
  AppTextParser::~AppTextParser(&local_268);
  return;
}

Assistant:

void App::loadTextFile(const std::string& textFile)
{
    AppTextParser aparser(textFile);
    aparser.preParseFile({});
    loadConfigOptions(aparser);
}